

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d.cpp
# Opt level: O2

void __thiscall
ncnn::Convolution1D::make_padding
          (Convolution1D *this,Mat *bottom_blob,Mat *bottom_blob_bordered,int _kernel_w,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  float v;
  Option opt_b;
  Option local_78;
  
  iVar1 = bottom_blob->w;
  iVar2 = (_kernel_w + -1) * this->dilation_w;
  Mat::operator=(bottom_blob_bordered,bottom_blob);
  uVar4 = this->pad_left;
  uVar3 = this->pad_right;
  if ((int)uVar3 < 1 && (int)uVar4 < 1) {
    if (uVar3 == 0xffffff17 && uVar4 == 0xffffff17) {
      uVar3 = iVar2 - (iVar1 + -1) % this->stride_w;
      if ((int)uVar3 < 1) {
        return;
      }
      local_78.lightmode = opt->lightmode;
      local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
      local_78.num_threads = opt->num_threads;
      local_78.workspace_allocator = opt->workspace_allocator;
      local_78.openmp_blocktime = opt->openmp_blocktime;
      local_78.use_winograd_convolution = opt->use_winograd_convolution;
      local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
      local_78.use_int8_inference = opt->use_int8_inference;
      local_78.use_vulkan_compute = opt->use_vulkan_compute;
      local_78.use_bf16_storage = opt->use_bf16_storage;
      local_78.use_fp16_packed = opt->use_fp16_packed;
      local_78.use_fp16_storage = opt->use_fp16_storage;
      local_78.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      local_78.use_int8_packed = opt->use_int8_packed;
      local_78.use_int8_storage = opt->use_int8_storage;
      local_78.use_int8_arithmetic = opt->use_int8_arithmetic;
      local_78.use_packing_layout = opt->use_packing_layout;
      local_78.use_shader_pack8 = opt->use_shader_pack8;
      local_78.use_subgroup_basic = opt->use_subgroup_basic;
      local_78.use_subgroup_vote = opt->use_subgroup_vote;
      local_78.use_subgroup_ballot = opt->use_subgroup_ballot;
      local_78.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      local_78.use_image_storage = opt->use_image_storage;
      local_78.use_tensor_storage = opt->use_tensor_storage;
      local_78.use_weight_fp16_storage = opt->use_weight_fp16_storage;
      local_78.flush_denormals = opt->flush_denormals;
      local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
      local_78.use_reserved_1 = opt->use_reserved_1;
      local_78.use_reserved_2 = opt->use_reserved_2;
      local_78.use_reserved_3 = opt->use_reserved_3;
      local_78.use_reserved_4 = opt->use_reserved_4;
      local_78.use_reserved_5 = opt->use_reserved_5;
      local_78.use_reserved_6 = opt->use_reserved_6;
      local_78.use_reserved_7 = opt->use_reserved_7;
      local_78.use_reserved_8 = opt->use_reserved_8;
      local_78.use_reserved_9 = opt->use_reserved_9;
      local_78.use_reserved_10 = opt->use_reserved_10;
      local_78.use_reserved_11 = opt->use_reserved_11;
      local_78.blob_allocator = opt->workspace_allocator;
      uVar4 = uVar3 >> 1;
      uVar3 = uVar3 - uVar4;
      v = this->pad_value;
    }
    else {
      if (uVar3 != 0xffffff16 || uVar4 != 0xffffff16) {
        return;
      }
      uVar4 = iVar2 - (iVar1 + -1) % this->stride_w;
      if ((int)uVar4 < 1) {
        return;
      }
      local_78.lightmode = opt->lightmode;
      local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
      local_78.num_threads = opt->num_threads;
      local_78.workspace_allocator = opt->workspace_allocator;
      local_78.openmp_blocktime = opt->openmp_blocktime;
      local_78.use_winograd_convolution = opt->use_winograd_convolution;
      local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
      local_78.use_int8_inference = opt->use_int8_inference;
      local_78.use_vulkan_compute = opt->use_vulkan_compute;
      local_78.use_bf16_storage = opt->use_bf16_storage;
      local_78.use_fp16_packed = opt->use_fp16_packed;
      local_78.use_fp16_storage = opt->use_fp16_storage;
      local_78.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      local_78.use_int8_packed = opt->use_int8_packed;
      local_78.use_int8_storage = opt->use_int8_storage;
      local_78.use_int8_arithmetic = opt->use_int8_arithmetic;
      local_78.use_packing_layout = opt->use_packing_layout;
      local_78.use_shader_pack8 = opt->use_shader_pack8;
      local_78.use_subgroup_basic = opt->use_subgroup_basic;
      local_78.use_subgroup_vote = opt->use_subgroup_vote;
      local_78.use_subgroup_ballot = opt->use_subgroup_ballot;
      local_78.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      local_78.use_image_storage = opt->use_image_storage;
      local_78.use_tensor_storage = opt->use_tensor_storage;
      local_78.use_weight_fp16_storage = opt->use_weight_fp16_storage;
      local_78.flush_denormals = opt->flush_denormals;
      local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
      local_78.use_reserved_1 = opt->use_reserved_1;
      local_78.use_reserved_2 = opt->use_reserved_2;
      local_78.use_reserved_3 = opt->use_reserved_3;
      local_78.use_reserved_4 = opt->use_reserved_4;
      local_78.use_reserved_5 = opt->use_reserved_5;
      local_78.use_reserved_6 = opt->use_reserved_6;
      local_78.use_reserved_7 = opt->use_reserved_7;
      local_78.use_reserved_8 = opt->use_reserved_8;
      local_78.use_reserved_9 = opt->use_reserved_9;
      local_78.use_reserved_10 = opt->use_reserved_10;
      local_78.use_reserved_11 = opt->use_reserved_11;
      local_78.blob_allocator = opt->workspace_allocator;
      uVar3 = uVar4 >> 1;
      uVar4 = uVar4 - uVar3;
      v = this->pad_value;
    }
  }
  else {
    local_78.lightmode = opt->lightmode;
    local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
    local_78.num_threads = opt->num_threads;
    local_78.workspace_allocator = opt->workspace_allocator;
    local_78.openmp_blocktime = opt->openmp_blocktime;
    local_78.use_winograd_convolution = opt->use_winograd_convolution;
    local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
    local_78.use_int8_inference = opt->use_int8_inference;
    local_78.use_vulkan_compute = opt->use_vulkan_compute;
    local_78.use_bf16_storage = opt->use_bf16_storage;
    local_78.use_fp16_packed = opt->use_fp16_packed;
    local_78.use_fp16_storage = opt->use_fp16_storage;
    local_78.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    local_78.use_int8_packed = opt->use_int8_packed;
    local_78.use_int8_storage = opt->use_int8_storage;
    local_78.use_int8_arithmetic = opt->use_int8_arithmetic;
    local_78.use_packing_layout = opt->use_packing_layout;
    local_78.use_shader_pack8 = opt->use_shader_pack8;
    local_78.use_subgroup_basic = opt->use_subgroup_basic;
    local_78.use_subgroup_vote = opt->use_subgroup_vote;
    local_78.use_subgroup_ballot = opt->use_subgroup_ballot;
    local_78.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    local_78.use_image_storage = opt->use_image_storage;
    local_78.use_tensor_storage = opt->use_tensor_storage;
    local_78.use_weight_fp16_storage = opt->use_weight_fp16_storage;
    local_78.flush_denormals = opt->flush_denormals;
    local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
    local_78.use_reserved_1 = opt->use_reserved_1;
    local_78.use_reserved_2 = opt->use_reserved_2;
    local_78.use_reserved_3 = opt->use_reserved_3;
    local_78.use_reserved_4 = opt->use_reserved_4;
    local_78.use_reserved_5 = opt->use_reserved_5;
    local_78.use_reserved_6 = opt->use_reserved_6;
    local_78.use_reserved_7 = opt->use_reserved_7;
    local_78.use_reserved_8 = opt->use_reserved_8;
    local_78.use_reserved_9 = opt->use_reserved_9;
    local_78.use_reserved_10 = opt->use_reserved_10;
    local_78.use_reserved_11 = opt->use_reserved_11;
    local_78.blob_allocator = opt->workspace_allocator;
    v = this->pad_value;
  }
  copy_make_border(bottom_blob,bottom_blob_bordered,0,0,uVar4,uVar3,0,v,&local_78);
  return;
}

Assistant:

void Convolution1D::make_padding(const Mat& bottom_blob, Mat& bottom_blob_bordered, int _kernel_w, const Option& opt) const
{
    int w = bottom_blob.w;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;

    bottom_blob_bordered = bottom_blob;
    if (pad_left > 0 || pad_right > 0)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_left == -233 && pad_right == -233)
    {
        // tensorflow padding=SAME or onnx padding=SAME_UPPER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        if (wpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    else if (pad_left == -234 && pad_right == -234)
    {
        // onnx padding=SAME_LOWER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        if (wpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
}